

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

char xSAT_SolverSearch(xSAT_Solver_t *s)

{
  double dVar1;
  xSAT_BQueue_t *p;
  iword iVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint local_54;
  int NextVar;
  uint CRef;
  uint nLBD;
  int BacktrackLevel;
  uint hConfl;
  iword conflictC;
  xSAT_Solver_t *s_local;
  
  _BacktrackLevel = 0;
  (s->Stats).nStarts = (s->Stats).nStarts + 1;
  conflictC = (iword)s;
  while( true ) {
    while (nLBD = xSAT_SolverPropagate((xSAT_Solver_t *)conflictC), nLBD != 0xffffffff) {
      *(long *)(conflictC + 0x158) = *(long *)(conflictC + 0x158) + 1;
      _BacktrackLevel = _BacktrackLevel + 1;
      iVar4 = xSAT_SolverDecisionLevel((xSAT_Solver_t *)conflictC);
      if (iVar4 == 0) {
        return -1;
      }
      p = *(xSAT_BQueue_t **)(conflictC + 0x88);
      uVar5 = Vec_IntSize(*(Vec_Int_t **)(conflictC + 0x68));
      xSAT_BQueuePush(p,uVar5);
      if (((long)*(int *)(conflictC + 0x118) < *(long *)(conflictC + 0x158)) &&
         (iVar4 = xSAT_BQueueIsValid(*(xSAT_BQueue_t **)(conflictC + 0x90)), iVar4 != 0)) {
        iVar4 = Vec_IntSize(*(Vec_Int_t **)(conflictC + 0x68));
        dVar1 = *(double *)(conflictC + 0x110);
        uVar5 = xSAT_BQueueAvg(*(xSAT_BQueue_t **)(conflictC + 0x88));
        if (dVar1 * (double)uVar5 < (double)iVar4) {
          xSAT_BQueueClean(*(xSAT_BQueue_t **)(conflictC + 0x90));
        }
      }
      Vec_IntClear(*(Vec_Int_t **)(conflictC + 0xb0));
      xSAT_SolverAnalyze((xSAT_Solver_t *)conflictC,nLBD,*(Vec_Int_t **)(conflictC + 0xb0),
                         (int *)&CRef,(uint *)&NextVar);
      *(float *)(conflictC + 0x98) = (float)(uint)NextVar + *(float *)(conflictC + 0x98);
      xSAT_BQueuePush(*(xSAT_BQueue_t **)(conflictC + 0x90),NextVar);
      xSAT_SolverCancelUntil((xSAT_Solver_t *)conflictC,CRef);
      iVar4 = Vec_IntSize(*(Vec_Int_t **)(conflictC + 0xb0));
      if (iVar4 == 1) {
        local_54 = 0xffffffff;
      }
      else {
        local_54 = xSAT_SolverClaNew((xSAT_Solver_t *)conflictC,*(Vec_Int_t **)(conflictC + 0xb0),1)
        ;
      }
      iVar2 = conflictC;
      iVar4 = Vec_IntEntry(*(Vec_Int_t **)(conflictC + 0xb0),0);
      xSAT_SolverEnqueue((xSAT_Solver_t *)iVar2,iVar4,local_54);
      xSAT_SolverVarActDecay((xSAT_Solver_t *)conflictC);
      xSAT_SolverClaActDecay((xSAT_Solver_t *)conflictC);
    }
    iVar4 = xSAT_BQueueIsValid(*(xSAT_BQueue_t **)(conflictC + 0x90));
    if ((iVar4 != 0) &&
       (uVar5 = xSAT_BQueueAvg(*(xSAT_BQueue_t **)(conflictC + 0x90)),
       (double)(*(float *)(conflictC + 0x98) / (float)*(long *)(conflictC + 0x158)) <
       (double)uVar5 * *(double *)(conflictC + 0x108))) break;
    iVar4 = xSAT_SolverDecisionLevel((xSAT_Solver_t *)conflictC);
    if (iVar4 == 0) {
      xSAT_SolverSimplify((xSAT_Solver_t *)conflictC);
    }
    if ((long)*(int *)(conflictC + 0x9c) <= *(long *)(conflictC + 0x158)) {
      *(long *)(conflictC + 0xa0) =
           *(long *)(conflictC + 0x158) / (long)*(int *)(conflictC + 0xa8) + 1;
      xSAT_SolverReduceDB((xSAT_Solver_t *)conflictC);
      *(int *)(conflictC + 0xa8) = *(int *)(conflictC + 0x128) + *(int *)(conflictC + 0xa8);
      *(int *)(conflictC + 0x9c) =
           (int)*(undefined8 *)(conflictC + 0xa0) * *(int *)(conflictC + 0xa8);
    }
    iVar4 = xSAT_SolverDecide((xSAT_Solver_t *)conflictC);
    iVar2 = conflictC;
    if (iVar4 == -1) {
      return '\x01';
    }
    cVar3 = Vec_StrEntry(*(Vec_Str_t **)(conflictC + 0x58),iVar4);
    iVar4 = xSAT_Var2Lit(iVar4,(int)cVar3);
    xSAT_SolverNewDecision((xSAT_Solver_t *)iVar2,iVar4);
  }
  xSAT_BQueueClean(*(xSAT_BQueue_t **)(conflictC + 0x90));
  xSAT_SolverCancelUntil((xSAT_Solver_t *)conflictC,0);
  return '\0';
}

Assistant:

char xSAT_SolverSearch( xSAT_Solver_t * s )
{
    iword conflictC  = 0;

    s->Stats.nStarts++;
    for (;;)
    {
        unsigned hConfl = xSAT_SolverPropagate( s );

        if ( hConfl != CRefUndef )
        {
            /* Conflict */
            int BacktrackLevel;
            unsigned nLBD;
            unsigned CRef;

            s->Stats.nConflicts++;
            conflictC++;

            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                return LBoolFalse;

            xSAT_BQueuePush( s->bqTrail, Vec_IntSize( s->vTrail ) );
            if ( s->Stats.nConflicts > s->Config.nFirstBlockRestart && xSAT_BQueueIsValid( s->bqLBD ) && ( Vec_IntSize( s->vTrail ) > ( s->Config.R * ( iword ) xSAT_BQueueAvg( s->bqTrail ) ) ) )
                xSAT_BQueueClean(s->bqLBD);

            Vec_IntClear( s->vLearntClause );
            xSAT_SolverAnalyze( s, hConfl, s->vLearntClause, &BacktrackLevel, &nLBD );

            s->nSumLBD += nLBD;
            xSAT_BQueuePush( s->bqLBD, nLBD );
            xSAT_SolverCancelUntil( s, BacktrackLevel );

            CRef = Vec_IntSize( s->vLearntClause ) == 1 ? CRefUndef : xSAT_SolverClaNew( s, s->vLearntClause , 1 );
            xSAT_SolverEnqueue( s, Vec_IntEntry( s->vLearntClause , 0 ), CRef );

            xSAT_SolverVarActDecay( s );
            xSAT_SolverClaActDecay( s );
        }
        else
        {
            /* No conflict */
            int NextVar;
            if ( xSAT_BQueueIsValid( s->bqLBD ) && ( ( ( iword )xSAT_BQueueAvg( s->bqLBD ) * s->Config.K ) > ( s->nSumLBD / s->Stats.nConflicts ) ) )
            {
                xSAT_BQueueClean( s->bqLBD );
                xSAT_SolverCancelUntil( s, 0 );
                return LBoolUndef;
            }

            // Simplify the set of problem clauses:
            if ( xSAT_SolverDecisionLevel( s ) == 0 )
                xSAT_SolverSimplify( s );

            // Reduce the set of learnt clauses:
            if ( s->Stats.nConflicts >= s->nConfBeforeReduce )
            {
                s->nRC1 = ( s->Stats.nConflicts / s->nRC2 ) + 1;
                xSAT_SolverReduceDB(s);
                s->nRC2 += s->Config.nIncReduce;
                s->nConfBeforeReduce = s->nRC1 * s->nRC2;
            }

            // New variable decision:
            NextVar = xSAT_SolverDecide( s );

            if ( NextVar == VarUndef )
                return LBoolTrue;

            xSAT_SolverNewDecision( s, xSAT_Var2Lit( NextVar, ( int ) Vec_StrEntry( s->vPolarity, NextVar ) ) );
        }
    }

    return LBoolUndef; // cannot happen
}